

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O2

int Abc_NtkDemiter(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  void *pvVar4;
  int iVar5;
  char *__s;
  uint uVar6;
  Abc_Obj_t *pNodeB;
  Abc_Obj_t *pNodeA;
  Abc_Obj_t *pNodeC;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x445,"int Abc_NtkDemiter(Abc_Ntk_t *)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x446,"int Abc_NtkDemiter(Abc_Ntk_t *)");
  }
  iVar5 = 0;
  pAVar2 = Abc_NtkPo(pNtk,0);
  iVar1 = Abc_NodeIsExorType((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray]);
  if (iVar1 == 0) {
    __s = "The root of the miter is not an EXOR gate.";
  }
  else {
    pAVar2 = Abc_NtkPo(pNtk,0);
    pAVar2 = Abc_NodeRecognizeMux
                       ((Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[*(pAVar2->vFanins).pArray],&pNodeA,
                        &pNodeB);
    pNodeC = pAVar2;
    if (1 < (CONCAT71(pNodeB._1_7_,(byte)pNodeB) ^ CONCAT71(pNodeA._1_7_,(byte)pNodeA))) {
      __assert_fail("Abc_ObjRegular(pNodeA) == Abc_ObjRegular(pNodeB)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                    ,0x44d,"int Abc_NtkDemiter(Abc_Ntk_t *)");
    }
    iVar1 = 0;
    pAVar3 = Abc_NtkPo(pNtk,0);
    if ((pAVar3->field_0x15 & 4) != 0) {
      pNodeA._0_1_ = (byte)pNodeA ^ 1;
      pNodeB._0_1_ = (byte)pNodeB ^ 1;
    }
    pAVar3 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar3,pAVar2);
    Abc_ObjAssignName(pAVar3,"addOut1",(char *)0x0);
    pAVar2 = Abc_NtkCreatePo(pNtk);
    Abc_ObjAddFanin(pAVar2,(Abc_Obj_t *)CONCAT71(pNodeB._1_7_,(byte)pNodeB));
    Abc_ObjAssignName(pAVar2,"addOut2",(char *)0x0);
    pNodeB._0_1_ = (byte)pNodeB & 0xfe;
    iVar5 = 1;
    p = Abc_NtkDfsNodes(pNtk,&pNodeC,1);
    p_00 = Abc_NtkDfsNodes(pNtk,&pNodeB,1);
    for (; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(p,iVar1);
      *(byte *)((long)pvVar4 + 0x14) = *(byte *)((long)pvVar4 + 0x14) | 0x10;
    }
    uVar6 = 0;
    for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(p_00,iVar1);
      uVar6 = uVar6 + ((*(uint *)((long)pvVar4 + 0x14) >> 4 & 1) != 0);
    }
    for (iVar1 = 0; iVar1 < p->nSize; iVar1 = iVar1 + 1) {
      pvVar4 = Vec_PtrEntry(p,iVar1);
      *(byte *)((long)pvVar4 + 0x14) = *(byte *)((long)pvVar4 + 0x14) & 0xef;
    }
    printf("First cone = %6d.  Second cone = %6d.  Common = %6d.\n",(ulong)(uint)p->nSize,
           (ulong)(uint)p_00->nSize,(ulong)uVar6);
    Vec_PtrFree(p);
    Vec_PtrFree(p_00);
    Abc_NtkOrderCisCos(pNtk);
    iVar1 = Abc_NtkCheck(pNtk);
    if (iVar1 != 0) {
      return 1;
    }
    __s = "Abc_NtkDemiter: The network check has failed.";
  }
  puts(__s);
  return iVar5;
}

Assistant:

int Abc_NtkDemiter( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNodeC, * pNodeA, * pNodeB, * pNode;
    Abc_Obj_t * pPoNew;
    Vec_Ptr_t * vNodes1, * vNodes2;
    int nCommon, i;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    if ( !Abc_NodeIsExorType(Abc_ObjFanin0(Abc_NtkPo(pNtk,0))) )
    {
        printf( "The root of the miter is not an EXOR gate.\n" );
        return 0;
    }
    pNodeC = Abc_NodeRecognizeMux( Abc_ObjFanin0(Abc_NtkPo(pNtk,0)), &pNodeA, &pNodeB );
    assert( Abc_ObjRegular(pNodeA) == Abc_ObjRegular(pNodeB) );
    if ( Abc_ObjFaninC0(Abc_NtkPo(pNtk,0)) )
    {
        pNodeA = Abc_ObjNot(pNodeA);
        pNodeB = Abc_ObjNot(pNodeB);
    }

    // add the PO corresponding to control input
    pPoNew = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pPoNew, pNodeC );
    Abc_ObjAssignName( pPoNew, "addOut1", NULL );

    // add the PO corresponding to other input
    pPoNew = Abc_NtkCreatePo( pNtk );
    Abc_ObjAddFanin( pPoNew, pNodeB );
    Abc_ObjAssignName( pPoNew, "addOut2", NULL );

    // mark the nodes in the first cone
    pNodeB = Abc_ObjRegular(pNodeB);
    vNodes1 = Abc_NtkDfsNodes( pNtk, &pNodeC, 1 );
    vNodes2 = Abc_NtkDfsNodes( pNtk, &pNodeB, 1 );

    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode, i )
        pNode->fMarkA = 1;
    nCommon = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes2, pNode, i )
        nCommon += pNode->fMarkA;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode, i )
        pNode->fMarkA = 0;

    printf( "First cone = %6d.  Second cone = %6d.  Common = %6d.\n", vNodes1->nSize, vNodes2->nSize, nCommon );
    Vec_PtrFree( vNodes1 );
    Vec_PtrFree( vNodes2 );

    // reorder the latches
    Abc_NtkOrderCisCos( pNtk );
    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
        printf( "Abc_NtkDemiter: The network check has failed.\n" );
    return 1;
}